

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O2

void my_canvas_vis_size(t_my_canvas *x,t_symbol *s,int ac,t_atom *av)

{
  int iVar1;
  t_float tVar2;
  
  tVar2 = atom_getfloatarg(0,ac,av);
  iVar1 = (int)tVar2;
  if ((int)tVar2 < 2) {
    iVar1 = 1;
  }
  x->x_vis_w = iVar1;
  if (1 < ac) {
    tVar2 = atom_getfloatarg(1,ac,av);
    iVar1 = 1;
    if (1 < (int)tVar2) {
      iVar1 = (int)tVar2;
    }
  }
  x->x_vis_h = iVar1;
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void my_canvas_vis_size(t_my_canvas *x, t_symbol *s, int ac, t_atom *av)
{
    int i;

    i = atom_getfloatarg(0, ac, av);
    if(i < 1)
        i = 1;
    x->x_vis_w = i;
    if(ac > 1)
    {
        i = atom_getfloatarg(1, ac, av);
        if(i < 1)
            i = 1;
    }
    x->x_vis_h = i;
    iemgui_size(x, &x->x_gui);
}